

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O1

wstring * cfgfile::
          format_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_cfgfile::string_trait_t>
          ::from_string(wstring *__return_storage_ptr__,
                       parser_info_t<cfgfile::string_trait_t> *param_1,string_t *value)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  pointer pcVar2;
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  pcVar2 = (value->_M_dataplus)._M_p;
  std::__cxx11::wstring::
  _M_replace_dispatch<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((wstring *)__return_storage_ptr__,paVar1,paVar1,pcVar2,pcVar2 + value->_M_string_length
            );
  return __return_storage_ptr__;
}

Assistant:

static std::wstring from_string( const parser_info_t< string_trait_t > &,
		const string_trait_t::string_t & value )
	{
		std::wstring res;
		res.assign( value.cbegin(), value.cend() );

		return res;
	}